

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_>::BaseWithoutMT
          (BaseWithoutMT<njoy::ENDFtk::section::Type<1,_460>_> *this,HEAD *head,int MAT,int MF)

{
  double AWR;
  undefined8 *puVar1;
  int args_1;
  char *args;
  double dVar2;
  
  AWR = *(double *)(head + 0x20);
  dVar2 = round(*(double *)(head + 0x28));
  BaseWithoutMT(this,(int)dVar2,AWR);
  if (*(int *)(head + 0x30) == MAT) {
    if (*(int *)(head + 0x34) == MF) {
      return;
    }
    tools::Log::error<char_const*>("Incorrect File number (MF).");
    tools::Log::info<char_const*,int>("Expected MF = {}",MF);
    args_1 = *(int *)(head + 0x34);
    args = "Encountered MF = {}";
  }
  else {
    tools::Log::error<char_const*>("Incorrect Material number (MAT).");
    tools::Log::info<char_const*,int>("Expected MAT = {}",MAT);
    args_1 = *(int *)(head + 0x30);
    args = "Encountered MAT = {}";
  }
  tools::Log::info<char_const*,int>(args,args_1);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

BaseWithoutMT( const HEAD& head, int MAT, int MF ) :
  BaseWithoutMT( head.ZA(), head.atomicWeightRatio() ) {

  if ( MAT != head.MAT() ) {

    Log::error( "Incorrect Material number (MAT)." );
    Log::info( "Expected MAT = {}", MAT );
    Log::info( "Encountered MAT = {}", head.MAT() );
    throw std::exception();
  }
  if ( MF != head.MF() ) {

    Log::error( "Incorrect File number (MF)." );
    Log::info( "Expected MF = {}", MF );
    Log::info( "Encountered MF = {}", head.MF() );
    throw std::exception();
  }
}